

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-path.c
# Opt level: O2

void plutovg_path_add_round_rect
               (plutovg_path_t *path,float x,float y,float w,float h,float rx,float ry)

{
  float x_00;
  float x1;
  float y_00;
  float fVar1;
  float y1;
  float x2;
  float x2_00;
  float y2;
  float x3;
  
  if (w * 0.5 <= rx) {
    rx = w * 0.5;
  }
  if (h * 0.5 <= ry) {
    ry = h * 0.5;
  }
  if ((((rx == 0.0) && (!NAN(rx))) && (ry == 0.0)) && (!NAN(ry))) {
    plutovg_path_add_rect(path,x,y,w,h);
    return;
  }
  x2 = w + x;
  y2 = h + y;
  plutovg_path_reserve(path,0x1c);
  y_00 = ry + y;
  plutovg_path_move_to(path,x,y_00);
  fVar1 = y_00 - ry * 0.5522848;
  x3 = rx + x;
  x2_00 = x3 - rx * 0.5522848;
  plutovg_path_cubic_to(path,x,fVar1,x2_00,y,x3,y);
  x_00 = x2 - rx;
  plutovg_path_line_to(path,x_00,y);
  x1 = rx * 0.5522848 + x_00;
  plutovg_path_cubic_to(path,x1,y,x2,fVar1,x2,y_00);
  fVar1 = y2 - ry;
  plutovg_path_line_to(path,x2,fVar1);
  y1 = ry * 0.5522848 + fVar1;
  plutovg_path_cubic_to(path,x2,y1,x1,y2,x_00,y2);
  plutovg_path_line_to(path,x3,y2);
  plutovg_path_cubic_to(path,x2_00,y2,x,y1,x,fVar1);
  plutovg_path_line_to(path,x,y_00);
  plutovg_path_close(path);
  return;
}

Assistant:

void plutovg_path_add_round_rect(plutovg_path_t* path, float x, float y, float w, float h, float rx, float ry)
{
    rx = plutovg_min(rx, w * 0.5f);
    ry = plutovg_min(ry, h * 0.5f);
    if(rx == 0.f && ry == 0.f) {
        plutovg_path_add_rect(path, x, y, w, h);
        return;
    }

    float right = x + w;
    float bottom = y + h;

    float cpx = rx * PLUTOVG_KAPPA;
    float cpy = ry * PLUTOVG_KAPPA;

    plutovg_path_reserve(path, 6 * 2 + 4 * 4);
    plutovg_path_move_to(path, x, y+ry);
    plutovg_path_cubic_to(path, x, y+ry-cpy, x+rx-cpx, y, x+rx, y);
    plutovg_path_line_to(path, right-rx, y);
    plutovg_path_cubic_to(path, right-rx+cpx, y, right, y+ry-cpy, right, y+ry);
    plutovg_path_line_to(path, right, bottom-ry);
    plutovg_path_cubic_to(path, right, bottom-ry+cpy, right-rx+cpx, bottom, right-rx, bottom);
    plutovg_path_line_to(path, x+rx, bottom);
    plutovg_path_cubic_to(path, x+rx-cpx, bottom, x, bottom-ry+cpy, x, bottom-ry);
    plutovg_path_line_to(path, x, y+ry);
    plutovg_path_close(path);
}